

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_serialization.hpp
# Opt level: O3

bool duckdb::FunctionSerializer::TypeRequiresAssignment(LogicalType *type)

{
  LogicalTypeId LVar1;
  element_type *peVar2;
  bool bVar3;
  
  while( true ) {
    LVar1 = type->id_;
    bVar3 = true;
    if (LVar1 < STRUCT) break;
    switch(LVar1) {
    case STRUCT:
      if ((type->type_info_).internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        return true;
      }
      peVar2 = (element_type *)StructType::GetChildCount(type);
      goto LAB_01196b8f;
    case LIST:
      if ((type->type_info_).internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        return true;
      }
      type = ListType::GetChildType(type);
      break;
    case MAP:
    case UNION:
      goto switchD_01196b57_caseD_66;
    default:
      goto switchD_01196b57_caseD_67;
    case ARRAY:
      if ((type->type_info_).internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        return true;
      }
      type = ArrayType::GetChildType(type);
    }
  }
  if ((SQLNULL < LVar1) && (LVar1 != ANY)) {
    if (LVar1 == DECIMAL) {
switchD_01196b57_caseD_66:
      peVar2 = (type->type_info_).internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
LAB_01196b8f:
      bVar3 = peVar2 == (element_type *)0x0;
    }
    else {
switchD_01196b57_caseD_67:
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

static bool TypeRequiresAssignment(const LogicalType &type) {
		switch (type.id()) {
		case LogicalTypeId::SQLNULL:
		case LogicalTypeId::ANY:
		case LogicalTypeId::INVALID:
			return true;
		case LogicalTypeId::DECIMAL:
		case LogicalTypeId::UNION:
		case LogicalTypeId::MAP:
			if (!type.AuxInfo()) {
				return true;
			}
			return false;
		case LogicalTypeId::LIST:
			if (!type.AuxInfo()) {
				return true;
			}
			return TypeRequiresAssignment(ListType::GetChildType(type));
		case LogicalTypeId::ARRAY:
			if (!type.AuxInfo()) {
				return true;
			}
			return TypeRequiresAssignment(ArrayType::GetChildType(type));
		case LogicalTypeId::STRUCT:
			if (!type.AuxInfo()) {
				return true;
			}
			if (StructType::GetChildCount(type) == 0) {
				return true;
			}
			return false;
		default:
			return false;
		}
	}